

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  uchar uVar1;
  int iVar2;
  uchar uVar3;
  int iVar4;
  int iVar5;
  int local_bc;
  int *local_b8;
  uchar *z;
  int est;
  int type;
  int bestval;
  int best;
  int *mymap;
  int local_88;
  int zlen;
  int p;
  int k;
  int j;
  int i;
  char *line_buffer;
  uchar *zlib;
  uchar *filt;
  uchar *o;
  uchar *out;
  uchar sig [8];
  int ctype [5];
  int *out_len_local;
  int n_local;
  int y_local;
  int x_local;
  int stride_bytes_local;
  uchar *pixels_local;
  
  sig[0] = 0xff;
  sig[1] = 0xff;
  sig[2] = 0xff;
  sig[3] = 0xff;
  sig[4] = '\0';
  sig[5] = '\0';
  sig[6] = '\0';
  sig[7] = '\0';
  out = (uchar *)0xa1a0a0d474e5089;
  y_local = stride_bytes;
  if (stride_bytes == 0) {
    y_local = x * n;
  }
  zlib = (uchar *)malloc((long)((x * n + 1) * y));
  if (zlib == (uchar *)0x0) {
    pixels_local = (uchar *)0x0;
  }
  else {
    _j = malloc((long)(x * n));
    if (_j == (void *)0x0) {
      free(zlib);
      pixels_local = (uchar *)0x0;
    }
    else {
      for (p = 0; p < y; p = p + 1) {
        if (p == 0) {
          local_b8 = stbi_write_png_to_mem::firstmap;
        }
        else {
          local_b8 = stbi_write_png_to_mem::mapping;
        }
        type = 0;
        est = 0x7fffffff;
        for (local_88 = 0; local_88 < 2; local_88 = local_88 + 1) {
          if (local_88 == 0) {
            local_bc = 0;
          }
          else {
            local_bc = type;
          }
          for (zlen = local_bc; zlen < 5; zlen = zlen + 1) {
            iVar4 = local_b8[zlen];
            z._0_4_ = 0;
            iVar5 = y_local * p;
            for (k = 0; iVar2 = n, k < n; k = k + 1) {
              switch(iVar4) {
              case 0:
                *(uchar *)((long)_j + (long)k) = pixels[(long)k + (long)iVar5];
                break;
              case 1:
                *(uchar *)((long)_j + (long)k) = pixels[(long)k + (long)iVar5];
                break;
              case 2:
                *(uchar *)((long)_j + (long)k) =
                     pixels[(long)k + (long)iVar5] - pixels[(long)(k - y_local) + (long)iVar5];
                break;
              case 3:
                *(uchar *)((long)_j + (long)k) =
                     pixels[(long)k + (long)iVar5] -
                     (char)((int)(uint)pixels[(long)(k - y_local) + (long)iVar5] >> 1);
                break;
              case 4:
                uVar1 = pixels[(long)k + (long)iVar5];
                uVar3 = stbiw__paeth(0,(uint)pixels[(long)(k - y_local) + (long)iVar5],0);
                *(uchar *)((long)_j + (long)k) = uVar1 - uVar3;
                break;
              case 5:
                *(uchar *)((long)_j + (long)k) = pixels[(long)k + (long)iVar5];
                break;
              case 6:
                *(uchar *)((long)_j + (long)k) = pixels[(long)k + (long)iVar5];
              }
            }
            while (k = iVar2, k < x * n) {
              switch(iVar4) {
              case 0:
                *(uchar *)((long)_j + (long)k) = pixels[(long)k + (long)iVar5];
                break;
              case 1:
                *(uchar *)((long)_j + (long)k) =
                     pixels[(long)k + (long)iVar5] - pixels[(long)(k - n) + (long)iVar5];
                break;
              case 2:
                *(uchar *)((long)_j + (long)k) =
                     pixels[(long)k + (long)iVar5] - pixels[(long)(k - y_local) + (long)iVar5];
                break;
              case 3:
                *(uchar *)((long)_j + (long)k) =
                     pixels[(long)k + (long)iVar5] -
                     (char)((int)((uint)pixels[(long)(k - n) + (long)iVar5] +
                                 (uint)pixels[(long)(k - y_local) + (long)iVar5]) >> 1);
                break;
              case 4:
                uVar1 = pixels[(long)k + (long)iVar5];
                uVar3 = stbiw__paeth((uint)pixels[(long)(k - n) + (long)iVar5],
                                     (uint)pixels[(long)(k - y_local) + (long)iVar5],
                                     (uint)pixels[(long)((k - y_local) - n) + (long)iVar5]);
                *(uchar *)((long)_j + (long)k) = uVar1 - uVar3;
                break;
              case 5:
                *(uchar *)((long)_j + (long)k) =
                     pixels[(long)k + (long)iVar5] -
                     (char)((int)(uint)pixels[(long)(k - n) + (long)iVar5] >> 1);
                break;
              case 6:
                uVar1 = pixels[(long)k + (long)iVar5];
                uVar3 = stbiw__paeth((uint)pixels[(long)(k - n) + (long)iVar5],0,0);
                *(uchar *)((long)_j + (long)k) = uVar1 - uVar3;
              }
              iVar2 = k + 1;
            }
            if (local_88 != 0) break;
            for (k = 0; k < x * n; k = k + 1) {
              iVar4 = (int)*(char *)((long)_j + (long)k);
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              z._0_4_ = iVar4 + (int)z;
            }
            if ((int)z < est) {
              est = (int)z;
              type = zlen;
            }
          }
        }
        zlib[p * (x * n + 1)] = (uchar)type;
        memmove(zlib + (long)(p * (x * n + 1)) + 1,_j,(long)(x * n));
      }
      free(_j);
      line_buffer = (char *)stbi_zlib_compress(zlib,y * (x * n + 1),(int *)((long)&mymap + 4),8);
      free(zlib);
      if (line_buffer == (char *)0x0) {
        pixels_local = (uchar *)0x0;
      }
      else {
        o = (uchar *)malloc((long)(mymap._4_4_ + 0x39));
        if (o == (uchar *)0x0) {
          pixels_local = (uchar *)0x0;
        }
        else {
          *out_len = mymap._4_4_ + 0x39;
          *(uchar **)o = out;
          o[8] = '\0';
          o[9] = '\0';
          o[10] = '\0';
          o[0xb] = '\r';
          o[0xc] = 'I';
          o[0xd] = 'H';
          o[0xe] = 'D';
          o[0xf] = 'R';
          o[0x10] = (uchar)((uint)x >> 0x18);
          o[0x11] = (uchar)((uint)x >> 0x10);
          o[0x12] = (uchar)((uint)x >> 8);
          o[0x13] = (uchar)x;
          o[0x14] = (uchar)((uint)y >> 0x18);
          o[0x15] = (uchar)((uint)y >> 0x10);
          o[0x16] = (uchar)((uint)y >> 8);
          o[0x17] = (uchar)y;
          o[0x18] = '\b';
          o[0x19] = (uchar)ctype[(long)n + -2];
          o[0x1a] = '\0';
          o[0x1b] = '\0';
          filt = o + 0x1d;
          o[0x1c] = '\0';
          stbiw__wpcrc(&filt,0xd);
          *filt = (uchar)((uint)mymap._4_4_ >> 0x18);
          filt[1] = (uchar)((uint)mymap._4_4_ >> 0x10);
          filt[2] = (uchar)((uint)mymap._4_4_ >> 8);
          filt[3] = (uchar)mymap._4_4_;
          filt[4] = 'I';
          filt[5] = 'D';
          filt[6] = 'A';
          filt[7] = 'T';
          filt = filt + 8;
          memmove(filt,line_buffer,(long)mymap._4_4_);
          filt = filt + mymap._4_4_;
          free(line_buffer);
          stbiw__wpcrc(&filt,mymap._4_4_);
          *filt = '\0';
          filt[1] = '\0';
          filt[2] = '\0';
          filt[3] = '\0';
          filt[4] = 'I';
          filt[5] = 'E';
          filt[6] = 'N';
          filt[7] = 'D';
          filt = filt + 8;
          stbiw__wpcrc(&filt,0);
          if (filt != o + *out_len) {
            __assert_fail("o == out + *out_len",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image_write.h"
                          ,0x2b3,
                          "unsigned char *stbi_write_png_to_mem(unsigned char *, int, int, int, int, int *)"
                         );
          }
          pixels_local = o;
        }
      }
    }
  }
  return pixels_local;
}

Assistant:

unsigned char *stbi_write_png_to_mem(unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int i,j,k,p,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      static int mapping[] = { 0,1,2,3,4 };
      static int firstmap[] = { 0,1,0,5,6 };
      int *mymap = j ? mapping : firstmap;
      int best = 0, bestval = 0x7fffffff;
      for (p=0; p < 2; ++p) {
         for (k= p?best:0; k < 5; ++k) {
            int type = mymap[k],est=0;
            unsigned char *z = pixels + stride_bytes*j;
            for (i=0; i < n; ++i)
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - (z[i-stride_bytes]>>1); break;
                  case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-stride_bytes],0)); break;
                  case 5: line_buffer[i] = z[i]; break;
                  case 6: line_buffer[i] = z[i]; break;
               }
            for (i=n; i < x*n; ++i) {
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i] - z[i-n]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - ((z[i-n] + z[i-stride_bytes])>>1); break;
                  case 4: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-stride_bytes], z[i-stride_bytes-n]); break;
                  case 5: line_buffer[i] = z[i] - (z[i-n]>>1); break;
                  case 6: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
               }
            }
            if (p) break;
            for (i=0; i < x*n; ++i)
               est += abs((signed char) line_buffer[i]);
            if (est < bestval) { bestval = est; best = k; }
         }
      }
      // when we get here, best contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) best;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, 8); // increase 8 to get smaller but use more memory
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = (unsigned char) ctype[n];
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}